

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O0

void predict(stagewise_poly *poly,single_learner *base,example *ec)

{
  example *in_RDX;
  stagewise_poly *in_RSI;
  example *in_RDI;
  
  in_RDI[1].super_example_predict.feature_space[0].space_names.end_array =
       (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)in_RDX;
  synthetic_create(in_RSI,in_RDX,false);
  LEARNER::learner<char,_example>::predict((learner<char,_example> *)ec,in_RDI,(size_t)in_RSI);
  in_RDX->partial_prediction =
       *(float *)&in_RDI[1].super_example_predict.feature_space[0].values.erase_count;
  in_RDX->updated_prediction =
       *(float *)((long)&in_RDI[1].super_example_predict.feature_space[0].values.erase_count + 4);
  (in_RDX->pred).scalar = in_RDI->loss;
  return;
}

Assistant:

void predict(stagewise_poly &poly, single_learner &base, example &ec)
{
  poly.original_ec = &ec;
  synthetic_create(poly, ec, false);
  base.predict(poly.synth_ec);
  ec.partial_prediction = poly.synth_ec.partial_prediction;
  ec.updated_prediction = poly.synth_ec.updated_prediction;
  ec.pred.scalar = poly.synth_ec.pred.scalar;
}